

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O2

void __thiscall cmExtraEclipseCDT4Generator::Generate(cmExtraEclipseCDT4Generator *this)

{
  string *__rhs;
  cmLocalGenerator *this_00;
  cmMakefile *this_01;
  bool bVar1;
  int iVar2;
  string *psVar3;
  uint majorVersion;
  uint minorVersion;
  string local_140;
  string eclipseVersion;
  RegularExpression regex;
  
  this_00 = *(((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->LocalGenerators).
             super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  this_01 = this_00->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&regex,"CMAKE_ECLIPSE_VERSION",(allocator<char> *)&local_140);
  psVar3 = cmMakefile::GetSafeDefinition(this_01,(string *)&regex);
  std::__cxx11::string::string((string *)&eclipseVersion,(string *)psVar3);
  std::__cxx11::string::~string((string *)&regex);
  cmsys::RegularExpression::RegularExpression(&regex,".*([0-9]+\\.[0-9]+).*");
  bVar1 = cmsys::RegularExpression::find(&regex,eclipseVersion._M_dataplus._M_p);
  if (bVar1) {
    majorVersion = 0;
    minorVersion = 0;
    cmsys::RegularExpressionMatch::match_abi_cxx11_(&local_140,&regex.regmatch,1);
    iVar2 = __isoc99_sscanf(local_140._M_dataplus._M_p,"%u.%u",&majorVersion,&minorVersion);
    std::__cxx11::string::~string((string *)&local_140);
    if (iVar2 == 2) {
      iVar2 = majorVersion * 1000 + minorVersion;
      if (iVar2 < 0xbbe) {
        this->SupportsVirtualFolders = false;
        this->SupportsMachO64Parser = false;
      }
      else if (iVar2 != 0xbbe) goto LAB_0025a0f1;
      this->SupportsGmakeErrorParser = false;
    }
  }
LAB_0025a0f1:
  cmLocalGenerator::GetSourceDirectory_abi_cxx11_(this_00);
  psVar3 = &this->HomeDirectory;
  std::__cxx11::string::_M_assign((string *)psVar3);
  cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(this_00);
  __rhs = &this->HomeOutputDirectory;
  std::__cxx11::string::_M_assign((string *)__rhs);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"CMAKE_ECLIPSE_GENERATE_LINKED_RESOURCES",
             (allocator<char> *)&majorVersion);
  bVar1 = cmMakefile::IsOn(this_01,&local_140);
  this->GenerateLinkedResources = bVar1;
  std::__cxx11::string::~string((string *)&local_140);
  bVar1 = std::operator!=(psVar3,__rhs);
  this->IsOutOfSourceBuild = bVar1;
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_140,"CMAKE_ECLIPSE_GENERATE_SOURCE_PROJECT",
               (allocator<char> *)&majorVersion);
    bVar1 = cmMakefile::IsOn(this_01,&local_140);
    this->GenerateSourceProject = bVar1;
    std::__cxx11::string::~string((string *)&local_140);
    if ((this->GenerateSourceProject & 1U) != 0) goto LAB_0025a21c;
  }
  else {
    this->GenerateSourceProject = false;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"ECLIPSE_CDT4_GENERATE_SOURCE_PROJECT",
             (allocator<char> *)&majorVersion);
  bVar1 = cmMakefile::IsOn(this_01,&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_140,
               "ECLIPSE_CDT4_GENERATE_SOURCE_PROJECT is set to TRUE, but this variable is not supported anymore since CMake 2.8.7.\nEnable CMAKE_ECLIPSE_GENERATE_SOURCE_PROJECT instead."
               ,(allocator<char> *)&majorVersion);
    cmMakefile::IssueMessage(this_01,WARNING,&local_140);
    std::__cxx11::string::~string((string *)&local_140);
  }
LAB_0025a21c:
  bVar1 = cmsys::SystemTools::IsSubDirectory(__rhs,psVar3);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_140,
               "The build directory is a subdirectory of the source directory.\nThis is not supported well by Eclipse. It is strongly recommended to use a build directory which is a sibling of the source directory."
               ,(allocator<char> *)&majorVersion);
    cmMakefile::IssueMessage(this_01,WARNING,&local_140);
    std::__cxx11::string::~string((string *)&local_140);
  }
  if (this->GenerateSourceProject == true) {
    CreateSourceProjectFile(this);
  }
  CreateProjectFile(this);
  CreateCProjectFile(this);
  cmsys::RegularExpression::~RegularExpression(&regex);
  std::__cxx11::string::~string((string *)&eclipseVersion);
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::Generate()
{
  cmLocalGenerator* lg = this->GlobalGenerator->GetLocalGenerators()[0];
  const cmMakefile* mf = lg->GetMakefile();

  std::string eclipseVersion = mf->GetSafeDefinition("CMAKE_ECLIPSE_VERSION");
  cmsys::RegularExpression regex(".*([0-9]+\\.[0-9]+).*");
  if (regex.find(eclipseVersion)) {
    unsigned int majorVersion = 0;
    unsigned int minorVersion = 0;
    int res =
      sscanf(regex.match(1).c_str(), "%u.%u", &majorVersion, &minorVersion);
    if (res == 2) {
      int version = majorVersion * 1000 + minorVersion;
      if (version < 3006) // 3.6 is Helios
      {
        this->SupportsVirtualFolders = false;
        this->SupportsMachO64Parser = false;
      }
      if (version < 3007) // 3.7 is Indigo
      {
        this->SupportsGmakeErrorParser = false;
      }
    }
  }

  // TODO: Decide if these are local or member variables
  this->HomeDirectory = lg->GetSourceDirectory();
  this->HomeOutputDirectory = lg->GetBinaryDirectory();

  this->GenerateLinkedResources =
    mf->IsOn("CMAKE_ECLIPSE_GENERATE_LINKED_RESOURCES");

  this->IsOutOfSourceBuild =
    (this->HomeDirectory != this->HomeOutputDirectory);

  this->GenerateSourceProject =
    (this->IsOutOfSourceBuild &&
     mf->IsOn("CMAKE_ECLIPSE_GENERATE_SOURCE_PROJECT"));

  if (!this->GenerateSourceProject &&
      (mf->IsOn("ECLIPSE_CDT4_GENERATE_SOURCE_PROJECT"))) {
    mf->IssueMessage(
      MessageType::WARNING,
      "ECLIPSE_CDT4_GENERATE_SOURCE_PROJECT is set to TRUE, "
      "but this variable is not supported anymore since CMake 2.8.7.\n"
      "Enable CMAKE_ECLIPSE_GENERATE_SOURCE_PROJECT instead.");
  }

  if (cmSystemTools::IsSubDirectory(this->HomeOutputDirectory,
                                    this->HomeDirectory)) {
    mf->IssueMessage(MessageType::WARNING,
                     "The build directory is a subdirectory "
                     "of the source directory.\n"
                     "This is not supported well by Eclipse. It is strongly "
                     "recommended to use a build directory which is a "
                     "sibling of the source directory.");
  }

  // NOTE: This is not good, since it pollutes the source tree. However,
  //       Eclipse doesn't allow CVS/SVN to work when the .project is not in
  //       the cvs/svn root directory. Hence, this is provided as an option.
  if (this->GenerateSourceProject) {
    // create .project file in the source tree
    this->CreateSourceProjectFile();
  }

  // create a .project file
  this->CreateProjectFile();

  // create a .cproject file
  this->CreateCProjectFile();
}